

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

bool __thiscall RenX::Server::updateClientList(Server *this)

{
  bool bVar1;
  int iVar2;
  rep rVar3;
  size_type sVar4;
  size_t sVar5;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  int result;
  Server *this_local;
  
  rVar3 = std::chrono::_V2::steady_clock::now();
  (this->m_lastClientListUpdate).__d.__r = rVar3;
  bVar1 = false;
  sVar4 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                    (&this->players);
  sVar5 = getBotCount(this);
  if (sVar4 != sVar5) {
    if (this->m_rconVersion < 4) {
      bVar6 = sv(anon_var_dwarf_553d0,0x25);
      iVar2 = sendSocket(this,bVar6);
    }
    else {
      bVar6 = sv("cclientvarlist ID SCORE CREDITS PING\n",0x25);
      iVar2 = sendSocket(this,bVar6);
    }
    bVar1 = 0 < iVar2;
  }
  sVar5 = getBotCount(this);
  if (sVar5 != 0) {
    if (this->m_rconVersion < 4) {
      bVar6 = sv(anon_var_dwarf_553f2,0x1d);
      iVar2 = sendSocket(this,bVar6);
    }
    else {
      bVar6 = sv("cbotvarlist ID SCORE CREDITS\n",0x1d);
      iVar2 = sendSocket(this,bVar6);
    }
    bVar1 = (bool)(0 < iVar2 | bVar1);
  }
  return bVar1;
}

Assistant:

bool RenX::Server::updateClientList() {
	m_lastClientListUpdate = std::chrono::steady_clock::now();

	int result = 0;
	if (this->players.size() != getBotCount()) {
		if (m_rconVersion >= 4)
			result = sendSocket("cclientvarlist ID SCORE CREDITS PING\n"sv) > 0;
		else
			result = sendSocket("cclientvarlist ID\xA0""SCORE\xA0""CREDITS\xA0""PING\n"sv) > 0;
	}

	if (getBotCount() != 0) {
		if (m_rconVersion >= 4)
			result |= sendSocket("cbotvarlist ID SCORE CREDITS\n"sv) > 0;
		else
			result |= sendSocket("cbotvarlist ID\xA0""SCORE\xA0""CREDITS\n"sv) > 0;
	}

	return result != 0;
}